

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

string * __thiscall
testing::internal::MatchMatrix::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,MatchMatrix *this)

{
  size_t sVar1;
  char *__s;
  ulong uVar2;
  ulong uVar3;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  if (this->num_elements_ != 0) {
    uVar3 = 0;
    __s = anon_var_dwarf_a22956 + 5;
    do {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,__s,sVar1);
      if (this->num_matchers_ != 0) {
        uVar2 = 0;
        do {
          std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->num_matchers_);
      }
      uVar3 = uVar3 + 1;
      __s = ";";
    } while (uVar3 < this->num_elements_);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string MatchMatrix::DebugString() const {
  ::std::stringstream ss;
  const char* sep = "";
  for (size_t i = 0; i < LhsSize(); ++i) {
    ss << sep;
    for (size_t j = 0; j < RhsSize(); ++j) {
      ss << HasEdge(i, j);
    }
    sep = ";";
  }
  return ss.str();
}